

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

ssize_t __thiscall JSON::JSON_array::write(JSON_array *this,int __fd,void *__buf,size_t __n)

{
  pointer pJVar1;
  undefined8 in_RAX;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  Pipeline *this_00;
  JSON *element;
  pointer element_00;
  undefined8 uStack_38;
  
  this_00 = (Pipeline *)CONCAT44(in_register_00000034,__fd);
  uStack_38 = in_RAX;
  Pipeline::operator<<(this_00,"[");
  uStack_38._7_1_ = true;
  pJVar1 = (this->elements).super__Vector_base<JSON,_std::allocator<JSON>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (element_00 = (this->elements).super__Vector_base<JSON,_std::allocator<JSON>_>._M_impl.
                    super__Vector_impl_data._M_start; element_00 != pJVar1;
      element_00 = element_00 + 1) {
    writeArrayItem(this_00,(bool *)((long)&uStack_38 + 7),element_00,(long)__buf + 1);
  }
  writeArrayClose(this_00,(bool)uStack_38._7_1_,(size_t)__buf);
  return extraout_RAX;
}

Assistant:

void
JSON::JSON_array::write(Pipeline* p, size_t depth) const
{
    bool first = true;
    writeArrayOpen(p, first, depth);
    for (auto const& element: elements) {
        writeArrayItem(p, first, element, 1 + depth);
    }
    writeArrayClose(p, first, depth);
}